

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_value.c
# Opt level: O1

void assert_parse_value(char *string,int type)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer buffer;
  parse_buffer local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.length = 0;
  local_58.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_58.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_58.offset = 0;
  local_58.depth = 0;
  local_58.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_58.content = (uchar *)string;
  sVar2 = strlen(string);
  local_58.length = sVar2 + 1;
  local_58.hooks.allocate = global_hooks.allocate;
  local_58.hooks.deallocate = global_hooks.deallocate;
  local_58.hooks.reallocate = global_hooks.reallocate;
  cVar1 = parse_value(item,&local_58);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x33);
  }
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  UnityAssertBits(0xff,(ulong)(uint)type,(long)item[0].type,"Item doesn\'t have expected type.",0x26
                 );
  UnityAssertBits(0x100,0,(long)item[0].type,"Item should not have a string as reference.",0x27);
  UnityAssertBits(0x200,0,(long)item[0].type,"Item should not have a const string.",0x28);
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x29);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_parse_value(const char *string, int type)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*) string;
    buffer.length = strlen(string) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE(parse_value(item, &buffer));
    assert_is_value(item, type);
}